

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_solve_for_update.c
# Opt level: O2

lu_int basiclu_solve_for_update
                 (lu_int *istore,double *xstore,lu_int *Li,double *Lx,lu_int *Ui,double *Ux,
                 lu_int *Wi,double *Wx,lu_int nzrhs,lu_int *irhs,double *xrhs,lu_int *p_nzlhs,
                 lu_int *ilhs,double *lhs,char trans)

{
  lu_int lVar1;
  int iVar2;
  lu_int *plVar3;
  long lVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  lu this;
  
  plVar3 = Li;
  lVar1 = lu_load(&this,istore,xstore,Li,Lx,Ui,Ux,Wi,Wx);
  if (lVar1 != 0) {
    return lVar1;
  }
  auVar6._0_4_ = -(uint)(Li == (lu_int *)0x0);
  auVar6._4_4_ = -(uint)(Lx == (double *)0x0);
  auVar6._8_4_ = -(uint)(Ui == (lu_int *)0x0);
  auVar6._12_4_ = -(uint)(Ux == (double *)0x0);
  iVar2 = movmskps((int)plVar3,auVar6);
  lVar1 = -3;
  if ((((iVar2 != 0) || (Wi == (lu_int *)0x0)) || (Wx == (double *)0x0)) ||
     ((irhs == (lu_int *)0x0 || (xrhs == (double *)0x0 && (trans & 0xdfU) != 0x54))))
  goto LAB_00390439;
  if (this.nupdate < 0) {
    lVar1 = -2;
    goto LAB_00390439;
  }
  if (this.nforrest == this.m) {
    lVar1 = -5;
    goto LAB_00390439;
  }
  if ((trans & 0xdfU) == 0x54) {
    if (-1 < *irhs && *irhs < this.m) {
LAB_0039049b:
      lVar1 = lu_solve_for_update(&this,nzrhs,irhs,xrhs,p_nzlhs,ilhs,lhs,trans);
      goto LAB_00390439;
    }
  }
  else {
    bVar5 = nzrhs <= this.m && -1 < nzrhs;
    lVar4 = 0;
    while ((lVar4 < nzrhs && (bVar5))) {
      bVar5 = irhs[lVar4] < this.m && -1 < irhs[lVar4];
      lVar4 = lVar4 + 1;
    }
    if (bVar5) goto LAB_0039049b;
  }
  lVar1 = -4;
LAB_00390439:
  lVar1 = lu_save(&this,istore,xstore,lVar1);
  return lVar1;
}

Assistant:

lu_int basiclu_solve_for_update
(
    lu_int istore[],
    double xstore[],
    lu_int Li[],
    double Lx[],
    lu_int Ui[],
    double Ux[],
    lu_int Wi[],
    double Wx[],
    lu_int nzrhs,
    const lu_int irhs[],
    const double xrhs[],
    lu_int *p_nzlhs,
    lu_int ilhs[],
    double lhs[],
    char trans
)
{
    struct lu this;
    lu_int status, n, ok;

    status = lu_load(&this, istore, xstore, Li, Lx, Ui, Ux, Wi, Wx);
    if (status != BASICLU_OK)
        return status;

    if (! (Li && Lx && Ui && Ux && Wi && Wx && irhs))
    {
        status = BASICLU_ERROR_argument_missing;
    }
    else if (trans != 't' && trans != 'T' && !xrhs)
    {
        status = BASICLU_ERROR_argument_missing;
    }
    else if (this.nupdate < 0)
    {
        status = BASICLU_ERROR_invalid_call;
    }
    else if (this.nforrest == this.m)
    {
        status = BASICLU_ERROR_maximum_updates;
    }
    else
    {
        /* check RHS indices */
        if (trans == 't' || trans == 'T')
        {
            ok = irhs[0] >= 0 && irhs[0] < this.m;
        }
        else
        {
            ok = nzrhs >= 0 && nzrhs <= this.m;
            for (n = 0; n < nzrhs && ok; n++)
            {
                ok = ok && irhs[n] >= 0 && irhs[n] < this.m;
            }
        }
        if (!ok)
            status = BASICLU_ERROR_invalid_argument;
    }

    if (status == BASICLU_OK)
    {
        /* may request reallocation */
        status = lu_solve_for_update(&this, nzrhs, irhs, xrhs, p_nzlhs, ilhs,
                                     lhs, trans);
    }

    return lu_save(&this, istore, xstore, status);
}